

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

UINT16 __thiscall tsip::b2_to_uint16(tsip *this,int bb,char r_code)

{
  UINT16 x;
  char r_code_local;
  int bb_local;
  tsip *this_local;
  
  x = 0;
  if (r_code == 'r') {
    x = (ushort)*(byte *)((long)&this->m_report + (long)bb + 1) * 0x100 +
        (ushort)*(byte *)((long)&this->m_report + (long)(bb + 1) + 1);
  }
  else if (r_code == 'e') {
    x = (ushort)*(byte *)((long)&this->m_report + (long)bb + 2) * 0x100 +
        (ushort)*(byte *)((long)&this->m_report + (long)(bb + 1) + 2);
  }
  return x;
}

Assistant:

UINT16 tsip::b2_to_uint16(int bb, char r_code) {
	UINT16 x = 0;

	if (r_code == 'r') {
		x = (m_report.report.data[bb] << 8) + m_report.report.data[bb+1];
	} else if (r_code == 'e') {
		x = (m_report.extended.data[bb] << 8) + m_report.extended.data[bb+1];
	}

	return x;
}